

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

opj_bool tcd_dc_level_shift_decode(opj_tcd_v2_t *p_tcd)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  int *piVar7;
  byte bVar8;
  long in_RDI;
  OPJ_FLOAT32 l_value;
  OPJ_UINT32 l_stride;
  OPJ_INT32 l_max;
  OPJ_INT32 l_min;
  OPJ_INT32 *l_current_ptr;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_UINT32 l_height;
  OPJ_UINT32 l_width;
  opj_tcd_tile_v2_t *l_tile;
  opj_tcp_v2_t *l_tcp;
  opj_tcd_resolution_v2_t *l_res;
  opj_image_comp_t *l_img_comp;
  opj_tccp_t *l_tccp;
  opj_tcd_tilecomp_v2_t *l_tile_comp;
  OPJ_UINT32 compno;
  int local_60;
  int local_5c;
  float *local_58;
  uint local_50;
  uint local_4c;
  long local_28;
  long local_20;
  int *local_18;
  uint local_c;
  
  lVar3 = **(long **)(in_RDI + 0x18);
  local_18 = *(int **)(lVar3 + 0x18);
  local_20 = *(long *)(*(long *)(in_RDI + 0x30) + 0x15d0);
  local_28 = *(long *)(*(long *)(in_RDI + 0x20) + 0x18);
  for (local_c = 0; local_c < *(uint *)(lVar3 + 0x10); local_c = local_c + 1) {
    piVar7 = (int *)(*(long *)(local_18 + 6) + (ulong)*(uint *)(local_28 + 0x24) * 0xb0);
    uVar4 = piVar7[2] - *piVar7;
    iVar1 = piVar7[3];
    iVar2 = piVar7[1];
    uVar5 = (local_18[2] - *local_18) - uVar4;
    if (*(int *)(local_28 + 0x20) == 0) {
      local_5c = 0;
      bVar8 = (byte)*(undefined4 *)(local_28 + 0x18);
    }
    else {
      local_5c = -(1 << ((char)*(undefined4 *)(local_28 + 0x18) - 1U & 0x1f));
      bVar8 = (char)*(undefined4 *)(local_28 + 0x18) - 1;
    }
    local_60 = (1 << (bVar8 & 0x1f)) + -1;
    local_58 = *(float **)(local_18 + 10);
    if (*(int *)(local_20 + 0x14) == 1) {
      for (local_50 = 0; local_50 < (uint)(iVar1 - iVar2); local_50 = local_50 + 1) {
        for (local_4c = 0; local_4c < uVar4; local_4c = local_4c + 1) {
          fVar6 = (float)int_clamp((int)*local_58 + *(int *)(local_20 + 0x434),local_5c,local_60);
          *local_58 = fVar6;
          local_58 = local_58 + 1;
        }
        local_58 = local_58 + uVar5;
      }
    }
    else {
      for (local_50 = 0; local_50 < (uint)(iVar1 - iVar2); local_50 = local_50 + 1) {
        for (local_4c = 0; local_4c < uVar4; local_4c = local_4c + 1) {
          fVar6 = (float)int_clamp((int)(long)ROUND(*local_58) + *(int *)(local_20 + 0x434),local_5c
                                   ,local_60);
          *local_58 = fVar6;
          local_58 = local_58 + 1;
        }
        local_58 = local_58 + uVar5;
      }
    }
    local_28 = local_28 + 0x38;
    local_20 = local_20 + 0x438;
    local_18 = local_18 + 0xe;
  }
  return 1;
}

Assistant:

opj_bool tcd_dc_level_shift_decode ( opj_tcd_v2_t *p_tcd )
{
	OPJ_UINT32 compno;
	opj_tcd_tilecomp_v2_t * l_tile_comp = 00;
	opj_tccp_t * l_tccp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_tcd_resolution_v2_t* l_res = 00;
	opj_tcp_v2_t * l_tcp = 00;
	opj_tcd_tile_v2_t * l_tile;
	OPJ_UINT32 l_width,l_height,i,j;
	OPJ_INT32 * l_current_ptr;
	OPJ_INT32 l_min, l_max;
	OPJ_UINT32 l_stride;

	l_tile = p_tcd->tcd_image->tiles;
	l_tile_comp = l_tile->comps;
	l_tcp = p_tcd->tcp;
	l_tccp = p_tcd->tcp->tccps;
	l_img_comp = p_tcd->image->comps;

	for (compno = 0; compno < l_tile->numcomps; compno++) {
		l_res = l_tile_comp->resolutions + l_img_comp->resno_decoded;
		l_width = (l_res->x1 - l_res->x0);
		l_height = (l_res->y1 - l_res->y0);
		l_stride = (l_tile_comp->x1 - l_tile_comp->x0) - l_width;

		if (l_img_comp->sgnd) {
			l_min = -(1 << (l_img_comp->prec - 1));
			l_max = (1 << (l_img_comp->prec - 1)) - 1;
		}
		else {
            l_min = 0;
			l_max = (1 << l_img_comp->prec) - 1;
		}

		l_current_ptr = l_tile_comp->data;

		if (l_tccp->qmfbid == 1) {
			for (j=0;j<l_height;++j) {
				for (i = 0; i < l_width; ++i) {
					*l_current_ptr = int_clamp(*l_current_ptr + l_tccp->m_dc_level_shift, l_min, l_max);
					++l_current_ptr;
				}
				l_current_ptr += l_stride;
			}
		}
		else {
			for (j=0;j<l_height;++j) {
				for (i = 0; i < l_width; ++i) {
					OPJ_FLOAT32 l_value = *((OPJ_FLOAT32 *) l_current_ptr);
					*l_current_ptr = int_clamp(lrintf(l_value) + l_tccp->m_dc_level_shift, l_min, l_max); ;
					++l_current_ptr;
				}
				l_current_ptr += l_stride;
			}
		}

		++l_img_comp;
		++l_tccp;
		++l_tile_comp;
	}

	return OPJ_TRUE;
}